

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

void __thiscall sf::String::String(String *this,Uint32 utf32Char)

{
  (this->m_string)._M_dataplus._M_p = (pointer)&(this->m_string).field_2;
  (this->m_string)._M_string_length = 0;
  (this->m_string).field_2._M_local_buf[0] = 0;
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  push_back(&this->m_string,utf32Char);
  return;
}

Assistant:

String::String(Uint32 utf32Char)
{
    m_string += utf32Char;
}